

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

int16_t modify_stat_value(wchar_t value,wchar_t amount)

{
  wchar_t wVar1;
  bool bVar2;
  
  if (amount < L'\x01') {
    if (amount < L'\0') {
      for (; amount != L'\0'; amount = amount + L'\x01') {
        if (value < L'\x1c') {
          wVar1 = L'\x12';
          if (value < L'\x13') {
            wVar1 = value - (uint)(L'\x03' < value);
          }
        }
        else {
          wVar1 = value + L'\xfffffff6';
        }
        value = wVar1;
      }
    }
  }
  else {
    while (bVar2 = amount != L'\0', amount = amount + L'\xffffffff', bVar2) {
      value = value + (uint)(L'\x11' < value) * 9 + L'\x01';
    }
  }
  return (int16_t)value;
}

Assistant:

int16_t modify_stat_value(int value, int amount)
{
	int i;

	/* Reward or penalty */
	if (amount > 0) {
		/* Apply each point */
		for (i = 0; i < amount; i++) {
			/* One point at a time */
			if (value < 18) value++;

			/* Ten "points" at a time */
			else value += 10;
		}
	} else if (amount < 0) {
		/* Apply each point */
		for (i = 0; i < (0 - amount); i++) {
			/* Ten points at a time */
			if (value >= 18+10) value -= 10;

			/* Hack -- prevent weirdness */
			else if (value > 18) value = 18;

			/* One point at a time */
			else if (value > 3) value--;
		}
	}

	/* Return new value */
	return (value);
}